

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

void __thiscall
RigidBodyDynamics::ConstraintSet::SetActuationMap
          (ConstraintSet *this,Model *model,vector<bool,_std::allocator<bool>_> *actuatedDofUpd)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  const_reference cVar4;
  uint uVar5;
  uint uVar6;
  ulong rows;
  ulong uVar7;
  ulong uVar8;
  uint i;
  ulong __n;
  ulong rows_00;
  ulong rows_01;
  
  uVar1 = model->dof_count;
  rows_00 = (ulong)uVar1;
  lVar2 = *(long *)(this + 0x20);
  lVar3 = *(long *)(this + 0x28);
  uVar6 = 0;
  for (uVar5 = 0;
      (ulong)uVar5 <
      (ulong)(actuatedDofUpd->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(actuatedDofUpd->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(actuatedDofUpd->super__Bvector_base<std::allocator<bool>_>)._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8; uVar5 = uVar5 + 1)
  {
    cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](actuatedDofUpd,(ulong)uVar5);
    uVar6 = uVar6 + cVar4;
  }
  rows_01 = (ulong)(uVar1 - uVar6);
  rows = (ulong)uVar6;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x1e8),rows,
        (ulong)model->dof_count);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x1e8));
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x200),rows_01,
        (ulong)model->dof_count);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x200));
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x218),rows,rows);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x218));
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x230),rows,rows);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x230));
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x248),rows);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x248));
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 600),rows);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x268),rows_01);
  uVar7 = 0;
  uVar8 = 0;
  for (__n = 0; __n < model->dof_count; __n = __n + 1) {
    cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](actuatedDofUpd,__n);
    if (cVar4) {
      *(undefined8 *)(*(long *)(this + 0x1f0) * __n * 8 + *(long *)(this + 0x1e8) + uVar7 * 8) =
           0x3ff0000000000000;
      uVar7 = (ulong)((int)uVar7 + 1);
    }
    else {
      *(undefined8 *)(*(long *)(this + 0x208) * __n * 8 + *(long *)(this + 0x200) + uVar8 * 8) =
           0x3ff0000000000000;
      uVar8 = (ulong)((int)uVar8 + 1);
    }
  }
  uVar8 = lVar3 - lVar2 >> 5;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x278),rows_00,rows_00);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x278));
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x290),rows,rows);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x290));
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x2a8),rows,rows_01);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x2a8));
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x2c0),rows_01,rows);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x2c0));
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x2d8),rows_01,rows_01);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x2d8));
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x338),rows_00);
  uVar7 = uVar8 & 0xffffffff;
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x348),uVar7,uVar7);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x360),uVar7);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
  ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x370),
        (ulong)(uVar1 - (int)uVar8));
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x2f0),rows_00,uVar7);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x308),rows,uVar7);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 800),rows_01,uVar7);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x470),uVar7,rows_01);
  return;
}

Assistant:

void ConstraintSet::SetActuationMap(const Model &model,
                                    const std::vector<bool> &actuatedDofUpd)
{

  assert(actuatedDofUpd.size() == model.dof_count);

  unsigned int n  = unsigned( int( model.dof_count ));
  unsigned int nc = unsigned( int( name.size() ));
  unsigned int na = 0; //actuated dofs
  unsigned int nu = 0; //unactuated dofs

  for(unsigned int i=0; i<actuatedDofUpd.size(); ++i) {
    if(actuatedDofUpd[i]) {
      ++na;
    }
  }
  nu = n-na;

  S.conservativeResize(na,model.dof_count);
  S.setZero();
  P.conservativeResize(n-na,model.dof_count);
  P.setZero();
  W.conservativeResize(na,na);
  W.setZero();
  Winv.conservativeResize(na,na);
  Winv.setZero();
  WinvSC.conservativeResize(na);
  WinvSC.setZero();

  u.resize(na);
  v.resize(nu);

  unsigned int j=0;
  unsigned int k=0;
  for(unsigned int i=0; i<model.dof_count; ++i) {
    if(actuatedDofUpd[i]) {
      S(j,i) = 1.;
      ++j;
    } else {
      P(k,i) = 1.;
      ++k;
    }
  }

  unsigned int dim = n+n+nc+na;

  //Null space method variable initialization
  dim = na+nu;
  F.conservativeResize(dim,dim);
  F.setZero();

  Ful.conservativeResize(na,na);
  Ful.setZero();
  Fur.conservativeResize(na,nu);
  Fur.setZero();
  Fll.conservativeResize(nu,na);
  Fll.setZero();
  Flr.conservativeResize(nu,nu);
  Flr.setZero();

  g.conservativeResize(n);

  Ru.conservativeResize(nc,nc);
  py.conservativeResize(nc);
  pz.conservativeResize(n-nc);

  GT.conservativeResize(n,nc);
  GTu.conservativeResize(na,nc);
  GTl.conservativeResize(nu,nc);

  GPT.conservativeResize(nc,nu);

}